

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inttype.cpp
# Opt level: O2

void __thiscall IntegerType::IntegerType(IntegerType *this,ostream *os)

{
  long lVar1;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_00;
  initializer_list<Function> __l_01;
  allocator local_ec7;
  allocator local_ec6;
  allocator local_ec5;
  allocator local_ec4;
  allocator local_ec3;
  allocator local_ec2;
  allocator local_ec1;
  allocator local_ec0;
  allocator local_ebf;
  OperatorChar local_ebe;
  OperatorChar local_ebb;
  OperatorChar local_eb8;
  OperatorChar local_eb4;
  OperatorChar local_eb0;
  OperatorChar local_eac;
  OperatorChar local_ea8;
  OperatorChar local_ea4;
  OperatorChar local_ea0;
  OperatorChar local_e9c;
  OperatorChar local_e98;
  OperatorChar local_e94;
  OperatorChar local_e90;
  OperatorChar local_e8c;
  OperatorChar local_e88;
  allocator_type local_e83;
  allocator local_e82;
  allocator local_e81;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e80;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e78;
  _Any_data local_e70;
  code *local_e60;
  code *local_e58;
  _Any_data local_e50;
  code *local_e40;
  code *local_e38;
  _Any_data local_e30;
  code *local_e20;
  code *local_e18;
  _Any_data local_e10;
  code *local_e00;
  code *local_df8;
  _Any_data local_df0;
  code *local_de0;
  code *local_dd8;
  _Any_data local_dd0;
  code *local_dc0;
  code *local_db8;
  _Any_data local_db0;
  code *local_da0;
  code *local_d98;
  _Any_data local_d90;
  code *local_d80;
  code *local_d78;
  _Any_data local_d70;
  code *local_d60;
  code *local_d58;
  _Any_data local_d50;
  code *local_d40;
  code *local_d38;
  vector<Function,_std::allocator<Function>_> local_d30;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  Operator local_a98;
  _Any_data local_a48;
  code *local_a38;
  code *local_a30;
  _Any_data local_a28;
  code *local_a18;
  code *local_a10;
  _Any_data local_a08;
  code *local_9f8;
  code *local_9f0;
  _Any_data local_9e8;
  code *local_9d8;
  code *local_9d0;
  _Any_data local_9c8;
  code *local_9b8;
  code *local_9b0;
  _Any_data local_9a8;
  code *local_998;
  code *local_990;
  _Any_data local_988;
  code *local_978;
  code *local_970;
  _Any_data local_968;
  code *local_958;
  code *local_950;
  _Any_data local_948;
  code *local_938;
  code *local_930;
  _Any_data local_928;
  code *local_918;
  code *local_910;
  _Any_data local_908;
  code *local_8f8;
  code *local_8f0;
  _Any_data local_8e8;
  code *local_8d8;
  code *local_8d0;
  _Any_data local_8c8;
  code *local_8b8;
  code *local_8b0;
  EnvironmentScope local_8a8;
  Operator local_838;
  Operator local_7e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_798;
  Operator local_760;
  Operator local_710;
  Operator local_6c0;
  Operator local_670;
  Operator local_620;
  Operator local_5d0;
  Operator local_580;
  undefined1 local_530 [128];
  undefined1 local_4b0 [128];
  undefined1 local_430 [96];
  undefined1 local_3d0 [88];
  undefined1 local_378 [88];
  OperatorChar local_320 [2];
  char local_318 [80];
  OperatorChar local_2c8 [2];
  undefined1 local_2c0 [80];
  undefined1 local_270 [88];
  pair<const_OperatorChar,_Operator> local_218;
  undefined1 local_1c0 [144];
  Function local_130;
  Function local_b0;
  
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__IntegerType_0014e820;
  local_e78 = &(this->mBinaryOperators)._M_h;
  (this->mBinaryOperators)._M_h._M_buckets = &(this->mBinaryOperators)._M_h._M_single_bucket;
  (this->mBinaryOperators)._M_h._M_bucket_count = 1;
  (this->mBinaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBinaryOperators)._M_h._M_element_count = 0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBinaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e80 = &(this->mUnaryOperators)._M_h;
  (this->mUnaryOperators)._M_h._M_buckets = &(this->mUnaryOperators)._M_h._M_single_bucket;
  (this->mUnaryOperators)._M_h._M_bucket_count = 1;
  (this->mUnaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUnaryOperators)._M_h._M_element_count = 0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUnaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  EnvironmentScope::EnvironmentScope(&this->mEnvironment);
  local_ebf = (allocator)0x5e;
  OperatorChar::OperatorChar(&local_e88,'^');
  local_8c8._8_8_ = 0;
  local_8b0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:18:65)>
              ::_M_invoke;
  local_8b8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:18:65)>
              ::_M_manager;
  local_8c8._M_unused._M_object = this;
  Operator::binary((Operator *)&local_8a8,local_e88,6,RIGHT,(BinaryOperatorFn *)&local_8c8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_530,(char *)&local_ebf,
             (Operator *)&local_8a8);
  local_ec0 = (allocator)0x2a;
  OperatorChar::OperatorChar(&local_e8c,'*');
  local_8e8._M_unused._M_object = (void *)0x0;
  local_8e8._8_8_ = 0;
  local_8d0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:21:64)>
              ::_M_invoke;
  local_8d8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:21:64)>
              ::_M_manager;
  Operator::binary(&local_a98,local_e8c,5,LEFT,(BinaryOperatorFn *)&local_8e8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_530 + 0x58),(char *)&local_ec0,&local_a98)
  ;
  local_ec1 = (allocator)0x2f;
  OperatorChar::OperatorChar(&local_e90,'/');
  local_908._M_unused._M_object = (void *)0x0;
  local_908._8_8_ = 0;
  local_8f0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:24:64)>
              ::_M_invoke;
  local_8f8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:24:64)>
              ::_M_manager;
  Operator::binary(&local_7e8,local_e90,5,LEFT,(BinaryOperatorFn *)&local_908);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_4b0 + 0x30),(char *)&local_ec1,&local_7e8)
  ;
  local_ec2 = (allocator)0x25;
  OperatorChar::OperatorChar(&local_e94,'%');
  local_928._M_unused._M_object = (void *)0x0;
  local_928._8_8_ = 0;
  local_910 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:27:64)>
              ::_M_invoke;
  local_918 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:27:64)>
              ::_M_manager;
  Operator::binary(&local_838,local_e94,5,LEFT,(BinaryOperatorFn *)&local_928);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_430 + 8),(char *)&local_ec2,&local_838);
  local_ec3 = (allocator)0x2b;
  OperatorChar::OperatorChar(&local_e98,'+');
  local_948._M_unused._M_object = (void *)0x0;
  local_948._8_8_ = 0;
  local_930 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:30:64)>
              ::_M_invoke;
  local_938 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:30:64)>
              ::_M_manager;
  Operator::binary(&local_580,local_e98,4,LEFT,(BinaryOperatorFn *)&local_948);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_3d0,(char *)&local_ec3,&local_580);
  local_ec4 = (allocator)0x2d;
  OperatorChar::OperatorChar(&local_e9c,'-');
  local_968._M_unused._M_object = (void *)0x0;
  local_968._8_8_ = 0;
  local_950 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:33:64)>
              ::_M_invoke;
  local_958 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:33:64)>
              ::_M_manager;
  Operator::binary(&local_5d0,local_e9c,4,LEFT,(BinaryOperatorFn *)&local_968);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_378,(char *)&local_ec4,&local_5d0);
  OperatorChar::OperatorChar(&local_ebb,'<','<');
  OperatorChar::OperatorChar(&local_ea0,'<','<');
  local_988._M_unused._M_object = (void *)0x0;
  local_988._8_8_ = 0;
  local_970 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:36:102)>
              ::_M_invoke;
  local_978 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:36:102)>
              ::_M_manager;
  Operator::binary(&local_620,local_ea0,3,LEFT,(BinaryOperatorFn *)&local_988);
  local_320[0].mOp2 = local_ebb.mOp2;
  local_320[0].mIsTwoChars = local_ebb.mIsTwoChars;
  local_320[0].mOp1 = local_ebb.mOp1;
  Operator::Operator((Operator *)&local_320[2].mOp2,&local_620);
  OperatorChar::OperatorChar(&local_ebe,'>','>');
  OperatorChar::OperatorChar(&local_ea4,'>','>');
  local_9a8._M_unused._M_object = (void *)0x0;
  local_9a8._8_8_ = 0;
  local_990 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:39:102)>
              ::_M_invoke;
  local_998 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:39:102)>
              ::_M_manager;
  Operator::binary(&local_670,local_ea4,3,LEFT,(BinaryOperatorFn *)&local_9a8);
  local_2c8[0].mOp2 = local_ebe.mOp2;
  local_2c8[0].mIsTwoChars = local_ebe.mIsTwoChars;
  local_2c8[0].mOp1 = local_ebe.mOp1;
  Operator::Operator((Operator *)local_2c0,&local_670);
  local_ec5 = (allocator)0x7c;
  OperatorChar::OperatorChar(&local_ea8,'|');
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_9b0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:42:64)>
              ::_M_invoke;
  local_9b8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:42:64)>
              ::_M_manager;
  Operator::binary(&local_6c0,local_ea8,2,LEFT,(BinaryOperatorFn *)&local_9c8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_270,(char *)&local_ec5,&local_6c0);
  local_ec6 = (allocator)0x26;
  OperatorChar::OperatorChar(&local_eac,'&');
  local_9e8._M_unused._M_object = (void *)0x0;
  local_9e8._8_8_ = 0;
  local_9d0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:45:64)>
              ::_M_invoke;
  local_9d8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:45:64)>
              ::_M_manager;
  Operator::binary(&local_710,local_eac,2,LEFT,(BinaryOperatorFn *)&local_9e8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_218,(char *)&local_ec6,&local_710);
  local_ec7 = (allocator)0x3d;
  OperatorChar::OperatorChar(&local_eb0,'=');
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_9f0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:48:65)>
              ::_M_invoke;
  local_9f8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:48:65)>
              ::_M_manager;
  Operator::binary(&local_760,local_eb0,1,RIGHT,(BinaryOperatorFn *)&local_a08);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_1c0,(char *)&local_ec7,&local_760);
  __l._M_len = 0xb;
  __l._M_array = (iterator)local_530;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(local_e78,__l);
  lVar1 = 0x378;
  do {
    Operator::~Operator((Operator *)(local_530 + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x50);
  Operator::~Operator(&local_760);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  Operator::~Operator(&local_710);
  std::_Function_base::~_Function_base((_Function_base *)&local_9e8);
  Operator::~Operator(&local_6c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  Operator::~Operator(&local_670);
  std::_Function_base::~_Function_base((_Function_base *)&local_9a8);
  Operator::~Operator(&local_620);
  std::_Function_base::~_Function_base((_Function_base *)&local_988);
  Operator::~Operator(&local_5d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_968);
  Operator::~Operator(&local_580);
  std::_Function_base::~_Function_base((_Function_base *)&local_948);
  Operator::~Operator(&local_838);
  std::_Function_base::~_Function_base((_Function_base *)&local_928);
  Operator::~Operator(&local_7e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_908);
  Operator::~Operator(&local_a98);
  std::_Function_base::~_Function_base((_Function_base *)&local_8e8);
  Operator::~Operator((Operator *)&local_8a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_8c8);
  local_7e8.mOp.mIsTwoChars = true;
  OperatorChar::OperatorChar(&local_eb4,'-');
  local_a28._M_unused._M_object = (void *)0x0;
  local_a28._8_8_ = 0;
  local_a10 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:54:63)>
              ::_M_invoke;
  local_a18 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:54:63)>
              ::_M_manager;
  Operator::unary((Operator *)&local_8a8,local_eb4,7,LEFT,(UnaryOperatorFn *)&local_a28);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_530,(char *)&local_7e8,
             (Operator *)&local_8a8);
  local_838.mOp.mIsTwoChars = true;
  OperatorChar::OperatorChar(&local_eb8,'~');
  local_a48._M_unused._M_object = (void *)0x0;
  local_a48._8_8_ = 0;
  local_a30 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:57:63)>
              ::_M_invoke;
  local_a38 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:57:63)>
              ::_M_manager;
  Operator::unary(&local_a98,local_eb8,7,LEFT,(UnaryOperatorFn *)&local_a48);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_530 + 0x58),(char *)&local_838,&local_a98)
  ;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_530;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(local_e80,__l_00);
  lVar1 = 0x60;
  do {
    Operator::~Operator((Operator *)(local_530 + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x50);
  Operator::~Operator(&local_a98);
  std::_Function_base::~_Function_base((_Function_base *)&local_a48);
  Operator::~Operator((Operator *)&local_8a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a28);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_798,
               (initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
                )ZEXT816(0),0,
               (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a98,(key_equal *)&local_7e8,(allocator_type *)&local_838);
  std::__cxx11::string::string((string *)&local_ab8,"bitand",(allocator *)&local_580);
  local_d50._8_8_ = 0;
  local_d38 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:63:25)>
              ::_M_invoke;
  local_d40 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:63:25)>
              ::_M_manager;
  local_d50._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_ad8,"Computes bitwise AND between x and y.",(allocator *)&local_5d0);
  Function::Function((Function *)local_530,&local_ab8,2,(ExternalFunction *)&local_d50,&local_ad8);
  std::__cxx11::string::string((string *)&local_af8,"bitor",(allocator *)&local_620);
  local_d70._8_8_ = 0;
  local_d58 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:66:24)>
              ::_M_invoke;
  local_d60 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:66:24)>
              ::_M_manager;
  local_d70._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_b18,"Computes bitwise OR between x and y.",(allocator *)&local_670);
  Function::Function((Function *)local_4b0,&local_af8,2,(ExternalFunction *)&local_d70,&local_b18);
  std::__cxx11::string::string((string *)&local_b38,"bitxor",(allocator *)&local_6c0);
  local_d90._8_8_ = 0;
  local_d78 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:69:25)>
              ::_M_invoke;
  local_d80 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:69:25)>
              ::_M_manager;
  local_d90._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_b58,"Computes bitwise XOR between x and y.",(allocator *)&local_710);
  Function::Function((Function *)local_430,&local_b38,2,(ExternalFunction *)&local_d90,&local_b58);
  std::__cxx11::string::string((string *)&local_b78,"mod",(allocator *)&local_760);
  local_db0._8_8_ = 0;
  local_d98 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:72:22)>
              ::_M_invoke;
  local_da0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:72:22)>
              ::_M_manager;
  local_db0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_b98,"Computes x mod y.",(allocator *)&local_ebb);
  Function::Function((Function *)(local_3d0 + 0x20),&local_b78,2,(ExternalFunction *)&local_db0,
                     &local_b98);
  std::__cxx11::string::string((string *)&local_bb8,"powerMod",(allocator *)&local_ebe);
  local_dd0._8_8_ = 0;
  local_db8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:81:27)>
              ::_M_invoke;
  local_dc0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:81:27)>
              ::_M_manager;
  local_dd0._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&local_bd8,"Computes x^y mod z.",&local_ebf);
  Function::Function((Function *)(local_378 + 0x48),&local_bb8,3,(ExternalFunction *)&local_dd0,
                     &local_bd8);
  std::__cxx11::string::string((string *)&local_bf8,"gcd",&local_ec0);
  local_df0._8_8_ = 0;
  local_dd8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:87:22)>
              ::_M_invoke;
  local_de0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:87:22)>
              ::_M_manager;
  local_df0._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_c18,"Computes the greatest common divisor between x and y.",&local_ec1
            );
  Function::Function((Function *)(local_2c0 + 0x10),&local_bf8,2,(ExternalFunction *)&local_df0,
                     &local_c18);
  std::__cxx11::string::string((string *)&local_c38,"modInv",&local_ec2);
  local_e10._8_8_ = 0;
  local_df8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:90:25)>
              ::_M_invoke;
  local_e00 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:90:25)>
              ::_M_manager;
  local_e10._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_c58,"Tries to find the multiplicative inverse of x mod y.",&local_ec3)
  ;
  Function::Function((Function *)(local_270 + 0x40),&local_c38,2,(ExternalFunction *)&local_e10,
                     &local_c58);
  std::__cxx11::string::string((string *)&local_c78,"sqrt",&local_ec4);
  local_e30._8_8_ = 0;
  local_e18 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:101:23)>
              ::_M_invoke;
  local_e20 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:101:23)>
              ::_M_manager;
  local_e30._M_unused._M_object = this;
  std::__cxx11::string::string
            ((string *)&local_c98,"Returns the integer part of the square root of x.",&local_ec5);
  Function::Function((Function *)(local_1c0 + 0x10),&local_c78,1,(ExternalFunction *)&local_e30,
                     &local_c98);
  std::__cxx11::string::string((string *)&local_cb8,"twocomp",&local_ec6);
  local_e38 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:108:26)>
              ::_M_invoke;
  local_e40 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:108:26)>
              ::_M_manager;
  local_e50._M_unused._M_object = this;
  local_e50._8_8_ = os;
  std::__cxx11::string::string
            ((string *)&local_cd8,"Prints the given value in two-complements form.",&local_ec7);
  Function::Function(&local_130,&local_cb8,1,(ExternalFunction *)&local_e50,&local_cd8);
  std::__cxx11::string::string((string *)&local_cf8,"twocomp",&local_e81);
  local_e58 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:112:26)>
              ::_M_invoke;
  local_e60 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:112:26)>
              ::_M_manager;
  local_e70._M_unused._M_object = this;
  local_e70._8_8_ = os;
  std::__cxx11::string::string
            ((string *)&local_d18,"Prints the value x in two-complements form of size y.",&local_e82
            );
  Function::Function(&local_b0,&local_cf8,2,(ExternalFunction *)&local_e70,&local_d18);
  __l_01._M_len = 10;
  __l_01._M_array = (iterator)local_530;
  std::vector<Function,_std::allocator<Function>_>::vector(&local_d30,__l_01,&local_e83);
  EnvironmentScope::EnvironmentScope(&local_8a8,(Variables *)&local_798,&local_d30);
  EnvironmentScope::operator=(&this->mEnvironment,&local_8a8);
  EnvironmentScope::~EnvironmentScope(&local_8a8);
  std::vector<Function,_std::allocator<Function>_>::~vector(&local_d30);
  lVar1 = 0x480;
  do {
    Function::~Function((Function *)(local_530 + lVar1));
    lVar1 = lVar1 + -0x80;
  } while (lVar1 != -0x80);
  std::__cxx11::string::~string((string *)&local_d18);
  std::_Function_base::~_Function_base((_Function_base *)&local_e70);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e50);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::__cxx11::string::~string((string *)&local_c98);
  std::_Function_base::~_Function_base((_Function_base *)&local_e30);
  std::__cxx11::string::~string((string *)&local_c78);
  std::__cxx11::string::~string((string *)&local_c58);
  std::_Function_base::~_Function_base((_Function_base *)&local_e10);
  std::__cxx11::string::~string((string *)&local_c38);
  std::__cxx11::string::~string((string *)&local_c18);
  std::_Function_base::~_Function_base((_Function_base *)&local_df0);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::_Function_base::~_Function_base((_Function_base *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::__cxx11::string::~string((string *)&local_b98);
  std::_Function_base::~_Function_base((_Function_base *)&local_db0);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b58);
  std::_Function_base::~_Function_base((_Function_base *)&local_d90);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b18);
  std::_Function_base::~_Function_base((_Function_base *)&local_d70);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d50);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_798);
  return;
}

Assistant:

IntegerType::IntegerType(std::ostream& os) {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return power(lhs.intValue(), rhs.intValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() * rhs.intValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() / rhs.intValue();
		}) },
		{ '%', Operator::binary('%', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() % rhs.intValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() + rhs.intValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() - rhs.intValue();
		}) },
		{ OperatorChar('<', '<'), Operator::binary(OperatorChar('<', '<'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() << rhs.intValue();
		}) },
		{ OperatorChar('>', '>'), Operator::binary(OperatorChar('>', '>'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() >> rhs.intValue();
		}) },
		{ '|', Operator::binary('|', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() | rhs.intValue();
		}) },
		{ '&', Operator::binary('&', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() & rhs.intValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.intValue();
		}) },
		{ '~', Operator::unary('~', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return ~op.intValue();
		}) },
	};

	mEnvironment = EnvironmentScope(Variables({}), {
		Function("bitand", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise AND between x and y."),
		Function("bitor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() | args.at(1).intValue());
		}, "Computes bitwise OR between x and y."),
		Function("bitxor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise XOR between x and y."),
		Function("mod", 2, [this](FunctionArguments args) {
			std::int64_t result = args.at(0).intValue() % args.at(1).intValue();

			if (result < 0) {
				result += args.at(1).intValue();
			}

			return ResultValue(result);
		}, "Computes x mod y."),
		Function("powerMod", 3, [this](FunctionArguments args) {
			return ResultValue(
				powerMod(args.at(0).intValue(),
						 args.at(1).intValue(),
						 args.at(2).intValue()));
		}, "Computes x^y mod z."),
		Function("gcd", 2, [this](FunctionArguments args) {
			return ResultValue(gcd(args.at(0).intValue(), args.at(1).intValue()));
		}, "Computes the greatest common divisor between x and y."),
		Function("modInv", 2, [this](FunctionArguments args) {
			if (gcd(args[0].intValue(), args[1].intValue()) == 1) {
				return ResultValue(
					modularMultInverse(
						args.at(0).intValue(),
						args.at(1).intValue()));
			} else {
				throw std::runtime_error(
					std::to_string(args[0].intValue()) + " is not invertible mod " + std::to_string(args[1].intValue()) + ".");
			}
		}, "Tries to find the multiplicative inverse of x mod y."),
		Function("sqrt", 1, [this](FunctionArguments args) {
			if (args[0].intValue() >= 0) {
				return ResultValue(sqrt(args[0].intValue()));
			} else {
				throw std::runtime_error("The value must be >= 0.");
			}
		}, "Returns the integer part of the square root of x."),
		Function("twocomp", 1, [this, &os](FunctionArguments args) {
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue()) << std::endl;
			return ResultValue();
		}, "Prints the given value in two-complements form."),
		Function("twocomp", 2, [this, &os](FunctionArguments args) {
			int size = (int)args.at(1).intValue();
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue(), size) << std::endl;
			return ResultValue();
		}, "Prints the value x in two-complements form of size y."),
	});
}